

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

void __thiscall
bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::insert
          (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this,size_t index,bool bit)

{
  undefined1 in_stack_00000277;
  size_t in_stack_00000278;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000280;
  subtree_ref_base<false> in_stack_00000290;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffff90;
  
  std::
  unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator->((unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)0x12cb05);
  std::
  unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator->((unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)0x12cb14);
  internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::root(in_stack_ffffffffffffff90);
  internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::insert
            (in_stack_00000280,(subtree_ref)in_stack_00000290,in_stack_00000278,
             (bool)in_stack_00000277);
  return;
}

Assistant:

inline
    void bitvector_t<W, AP>::insert(size_t index, bool bit) {
        assert(valid() && "Can't access an uninitialized vector");
        _impl->insert(_impl->root(), index, bit);
    }